

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_socket.hpp
# Opt level: O0

bool __thiscall iutest::detail::BasicSocket::Open(BasicSocket *this,char *host,char *port)

{
  int iVar1;
  int iVar2;
  addrinfo *paStack_70;
  descriptor_t fd;
  addrinfo *curr;
  undefined1 local_60 [4];
  int err_no;
  addrinfo hints;
  addrinfo *servinfo;
  char *port_local;
  char *host_local;
  BasicSocket *this_local;
  
  if (this->m_socket == -1) {
    hints.ai_next = (addrinfo *)0x0;
    memset(local_60,0,0x30);
    err_no = 0;
    hints.ai_flags = 1;
    iVar1 = getaddrinfo(host,port,(addrinfo *)local_60,(addrinfo **)&hints.ai_next);
    if (iVar1 == 0) {
      for (paStack_70 = hints.ai_next; paStack_70 != (addrinfo *)0x0;
          paStack_70 = paStack_70->ai_next) {
        iVar1 = socket(paStack_70->ai_family,paStack_70->ai_socktype,paStack_70->ai_protocol);
        if (iVar1 != -1) {
          iVar2 = connect(iVar1,(sockaddr *)paStack_70->ai_addr,paStack_70->ai_addrlen);
          if (iVar2 != -1) {
            this->m_socket = iVar1;
            break;
          }
          Close(iVar1);
        }
      }
      freeaddrinfo((addrinfo *)hints.ai_next);
      this_local._7_1_ = this->m_socket != -1;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Open(const char* host, const char* port)
    {
        if( m_socket != INVALID_DESCRIPTOR )
        {
            return true;
        }
        addrinfo* servinfo = NULL;
        addrinfo hints;
        memset(&hints, 0, sizeof(hints));
        hints.ai_family = AF_UNSPEC;
        hints.ai_socktype = SOCK_STREAM;
        const int err_no = getaddrinfo(host, port, &hints, &servinfo);
        if( err_no != 0 )
        {
            return false;
        }

        for( addrinfo* curr=servinfo; curr != NULL; curr = curr->ai_next )
        {
            const descriptor_t fd = socket(curr->ai_family, curr->ai_socktype, curr->ai_protocol);
            if( fd != INVALID_DESCRIPTOR )
            {
                if( connect(fd, curr->ai_addr, static_cast<length_t>(curr->ai_addrlen)) != -1 )
                {
                    m_socket = fd;
                    break;
                }
                Close(fd);
            }
        }
        freeaddrinfo(servinfo);
        return (m_socket != INVALID_DESCRIPTOR);
    }